

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_common.hxx
# Opt level: O0

void __thiscall calc_server::server_stuff::server_stuff(server_stuff *this)

{
  undefined4 *in_RDI;
  nullptr_t in_stack_ffffffffffffff98;
  raft_launcher *this_00;
  allocator local_9 [9];
  
  *in_RDI = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 2),"localhost",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  in_RDI[10] = 25000;
  this_00 = (raft_launcher *)(in_RDI + 0xc);
  std::__cxx11::string::string((string *)this_00);
  std::shared_ptr<nuraft::logger>::shared_ptr
            ((shared_ptr<nuraft::logger> *)this_00,in_stack_ffffffffffffff98);
  std::shared_ptr<nuraft::state_machine>::shared_ptr
            ((shared_ptr<nuraft::state_machine> *)this_00,in_stack_ffffffffffffff98);
  std::shared_ptr<nuraft::state_mgr>::shared_ptr
            ((shared_ptr<nuraft::state_mgr> *)this_00,in_stack_ffffffffffffff98);
  nuraft::raft_launcher::raft_launcher(this_00);
  std::shared_ptr<nuraft::raft_server>::shared_ptr
            ((shared_ptr<nuraft::raft_server> *)this_00,in_stack_ffffffffffffff98);
  return;
}

Assistant:

server_stuff()
        : server_id_(1)
        , addr_("localhost")
        , port_(25000)
        , raft_logger_(nullptr)
        , sm_(nullptr)
        , smgr_(nullptr)
        , raft_instance_(nullptr)
        {}